

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O2

void __thiscall cbtCollisionWorldImporter::deleteAllData(cbtCollisionWorldImporter *this)

{
  cbtCollisionWorld *pcVar1;
  cbtCollisionShape *pcVar2;
  cbtOptimizedBvh *pcVar3;
  cbtTriangleInfoMap *pcVar4;
  cbtTriangleIndexVertexArray *pcVar5;
  char *pcVar6;
  cbtStridingMeshInterfaceData *pcVar7;
  cbtMeshPartData *pcVar8;
  void *pvVar9;
  cbtCollisionObject **ppcVar10;
  long lVar11;
  int a;
  long lVar12;
  long lVar13;
  
  for (lVar12 = 0; lVar12 < (this->m_allocatedCollisionObjects).m_size; lVar12 = lVar12 + 1) {
    pcVar1 = this->m_collisionWorld;
    ppcVar10 = (this->m_allocatedCollisionObjects).m_data;
    if (pcVar1 != (cbtCollisionWorld *)0x0) {
      (*pcVar1->_vptr_cbtCollisionWorld[0xb])(pcVar1,ppcVar10[lVar12]);
      ppcVar10 = (this->m_allocatedCollisionObjects).m_data;
    }
    if (ppcVar10[lVar12] != (cbtCollisionObject *)0x0) {
      (*ppcVar10[lVar12]->_vptr_cbtCollisionObject[1])();
    }
  }
  cbtAlignedObjectArray<cbtCollisionObject_*>::clear(&this->m_allocatedCollisionObjects);
  for (lVar12 = 0; lVar12 < (this->m_allocatedCollisionShapes).m_size; lVar12 = lVar12 + 1) {
    pcVar2 = (this->m_allocatedCollisionShapes).m_data[lVar12];
    if (pcVar2 != (cbtCollisionShape *)0x0) {
      (*pcVar2->_vptr_cbtCollisionShape[1])();
    }
  }
  cbtAlignedObjectArray<cbtCollisionShape_*>::clear(&this->m_allocatedCollisionShapes);
  for (lVar12 = 0; lVar12 < (this->m_allocatedBvhs).m_size; lVar12 = lVar12 + 1) {
    pcVar3 = (this->m_allocatedBvhs).m_data[lVar12];
    if (pcVar3 != (cbtOptimizedBvh *)0x0) {
      (*(pcVar3->super_cbtQuantizedBvh)._vptr_cbtQuantizedBvh[1])();
    }
  }
  cbtAlignedObjectArray<cbtOptimizedBvh_*>::clear(&this->m_allocatedBvhs);
  for (lVar12 = 0; lVar12 < (this->m_allocatedTriangleInfoMaps).m_size; lVar12 = lVar12 + 1) {
    pcVar4 = (this->m_allocatedTriangleInfoMaps).m_data[lVar12];
    if (pcVar4 != (cbtTriangleInfoMap *)0x0) {
      (*pcVar4->_vptr_cbtTriangleInfoMap[1])();
    }
  }
  cbtAlignedObjectArray<cbtTriangleInfoMap_*>::clear(&this->m_allocatedTriangleInfoMaps);
  for (lVar12 = 0; lVar12 < (this->m_allocatedTriangleIndexArrays).m_size; lVar12 = lVar12 + 1) {
    pcVar5 = (this->m_allocatedTriangleIndexArrays).m_data[lVar12];
    if (pcVar5 != (cbtTriangleIndexVertexArray *)0x0) {
      (*(pcVar5->super_cbtStridingMeshInterface)._vptr_cbtStridingMeshInterface[1])();
    }
  }
  cbtAlignedObjectArray<cbtTriangleIndexVertexArray_*>::clear(&this->m_allocatedTriangleIndexArrays)
  ;
  for (lVar12 = 0; lVar12 < (this->m_allocatedNames).m_size; lVar12 = lVar12 + 1) {
    pcVar6 = (this->m_allocatedNames).m_data[lVar12];
    if (pcVar6 != (char *)0x0) {
      operator_delete__(pcVar6);
    }
  }
  cbtAlignedObjectArray<char_*>::clear(&this->m_allocatedNames);
  for (lVar12 = 0; lVar12 < (this->m_allocatedcbtStridingMeshInterfaceDatas).m_size;
      lVar12 = lVar12 + 1) {
    pcVar7 = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data[lVar12];
    lVar11 = 0x28;
    for (lVar13 = 0; pcVar8 = pcVar7->m_meshPartsPtr, lVar13 < pcVar7->m_numMeshParts;
        lVar13 = lVar13 + 1) {
      pvVar9 = *(void **)((long)pcVar8 + lVar11 + -0x28);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      pvVar9 = *(void **)((long)pcVar8 + lVar11 + -0x20);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      pvVar9 = *(void **)((long)pcVar8 + lVar11 + -0x18);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      pvVar9 = *(void **)((long)pcVar8 + lVar11 + -0x10);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      pvVar9 = *(void **)((long)&pcVar8->m_vertices3f + lVar11);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      pvVar9 = *(void **)((long)pcVar8 + lVar11 + -8);
      if (pvVar9 != (void *)0x0) {
        operator_delete__(pvVar9);
      }
      lVar11 = lVar11 + 0x38;
    }
    if (pcVar8 != (cbtMeshPartData *)0x0) {
      operator_delete__(pcVar8);
    }
    ::operator_delete(pcVar7,0x20);
  }
  cbtAlignedObjectArray<cbtStridingMeshInterfaceData_*>::clear
            (&this->m_allocatedcbtStridingMeshInterfaceDatas);
  for (lVar12 = 0; lVar12 < (this->m_indexArrays).m_size; lVar12 = lVar12 + 1) {
    cbtAlignedFreeInternal((this->m_indexArrays).m_data[lVar12]);
  }
  cbtAlignedObjectArray<int_*>::clear(&this->m_indexArrays);
  for (lVar12 = 0; lVar12 < (this->m_shortIndexArrays).m_size; lVar12 = lVar12 + 1) {
    cbtAlignedFreeInternal((this->m_shortIndexArrays).m_data[lVar12]);
  }
  cbtAlignedObjectArray<short_*>::clear(&this->m_shortIndexArrays);
  for (lVar12 = 0; lVar12 < (this->m_charIndexArrays).m_size; lVar12 = lVar12 + 1) {
    cbtAlignedFreeInternal((this->m_charIndexArrays).m_data[lVar12]);
  }
  cbtAlignedObjectArray<unsigned_char_*>::clear(&this->m_charIndexArrays);
  for (lVar12 = 0; lVar12 < (this->m_floatVertexArrays).m_size; lVar12 = lVar12 + 1) {
    cbtAlignedFreeInternal((this->m_floatVertexArrays).m_data[lVar12]);
  }
  cbtAlignedObjectArray<cbtVector3FloatData_*>::clear(&this->m_floatVertexArrays);
  for (lVar12 = 0; lVar12 < (this->m_doubleVertexArrays).m_size; lVar12 = lVar12 + 1) {
    cbtAlignedFreeInternal((this->m_doubleVertexArrays).m_data[lVar12]);
  }
  cbtAlignedObjectArray<cbtVector3DoubleData_*>::clear(&this->m_doubleVertexArrays);
  return;
}

Assistant:

void cbtCollisionWorldImporter::deleteAllData()
{
	int i;

	for (i = 0; i < m_allocatedCollisionObjects.size(); i++)
	{
		if (m_collisionWorld)
			m_collisionWorld->removeCollisionObject(m_allocatedCollisionObjects[i]);
		delete m_allocatedCollisionObjects[i];
	}

	m_allocatedCollisionObjects.clear();

	for (i = 0; i < m_allocatedCollisionShapes.size(); i++)
	{
		delete m_allocatedCollisionShapes[i];
	}
	m_allocatedCollisionShapes.clear();

	for (i = 0; i < m_allocatedBvhs.size(); i++)
	{
		delete m_allocatedBvhs[i];
	}
	m_allocatedBvhs.clear();

	for (i = 0; i < m_allocatedTriangleInfoMaps.size(); i++)
	{
		delete m_allocatedTriangleInfoMaps[i];
	}
	m_allocatedTriangleInfoMaps.clear();
	for (i = 0; i < m_allocatedTriangleIndexArrays.size(); i++)
	{
		delete m_allocatedTriangleIndexArrays[i];
	}
	m_allocatedTriangleIndexArrays.clear();
	for (i = 0; i < m_allocatedNames.size(); i++)
	{
		delete[] m_allocatedNames[i];
	}
	m_allocatedNames.clear();

	for (i = 0; i < m_allocatedcbtStridingMeshInterfaceDatas.size(); i++)
	{
		cbtStridingMeshInterfaceData* curData = m_allocatedcbtStridingMeshInterfaceDatas[i];

		for (int a = 0; a < curData->m_numMeshParts; a++)
		{
			cbtMeshPartData* curPart = &curData->m_meshPartsPtr[a];
			if (curPart->m_vertices3f)
				delete[] curPart->m_vertices3f;

			if (curPart->m_vertices3d)
				delete[] curPart->m_vertices3d;

			if (curPart->m_indices32)
				delete[] curPart->m_indices32;

			if (curPart->m_3indices16)
				delete[] curPart->m_3indices16;

			if (curPart->m_indices16)
				delete[] curPart->m_indices16;

			if (curPart->m_3indices8)
				delete[] curPart->m_3indices8;
		}
		delete[] curData->m_meshPartsPtr;
		delete curData;
	}
	m_allocatedcbtStridingMeshInterfaceDatas.clear();

	for (i = 0; i < m_indexArrays.size(); i++)
	{
		cbtAlignedFree(m_indexArrays[i]);
	}
	m_indexArrays.clear();

	for (i = 0; i < m_shortIndexArrays.size(); i++)
	{
		cbtAlignedFree(m_shortIndexArrays[i]);
	}
	m_shortIndexArrays.clear();

	for (i = 0; i < m_charIndexArrays.size(); i++)
	{
		cbtAlignedFree(m_charIndexArrays[i]);
	}
	m_charIndexArrays.clear();

	for (i = 0; i < m_floatVertexArrays.size(); i++)
	{
		cbtAlignedFree(m_floatVertexArrays[i]);
	}
	m_floatVertexArrays.clear();

	for (i = 0; i < m_doubleVertexArrays.size(); i++)
	{
		cbtAlignedFree(m_doubleVertexArrays[i]);
	}
	m_doubleVertexArrays.clear();
}